

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O2

_Bool COSE_Recipient_SetKey(HCOSE_RECIPIENT h,cn_cbor *pKey,cose_errback *perr)

{
  _Bool _Var1;
  
  _Var1 = IsValidRecipientHandle(h);
  if (_Var1) {
    if (pKey != (cn_cbor *)0x0) {
      *(cn_cbor **)(h + 0x78) = pKey;
      return true;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Recipient_SetKey(HCOSE_RECIPIENT h, const cn_cbor * pKey, cose_errback * perr)
{
	COSE_RecipientInfo * p;

	CHECK_CONDITION(IsValidRecipientHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pKey != NULL, COSE_ERR_INVALID_PARAMETER);

	p = (COSE_RecipientInfo *)h;
	p->m_pkey = pKey;

	return true;

errorReturn:
	return false;
}